

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_sequenceTuple_create(sysbvm_context_t *context,sysbvm_tuple_t sequenceTupleType)

{
  _Bool _Var1;
  sysbvm_size_t slotCount_00;
  sysbvm_tuple_t result;
  size_t slotCount;
  sysbvm_sequenceTupleType_t *sequenceTupleTypeObject;
  sysbvm_tuple_t sequenceTupleType_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(sequenceTupleType);
  if (!_Var1) {
    sysbvm_error_nullArgument();
  }
  slotCount_00 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(sequenceTupleType + 0x58));
  if ((slotCount_00 == 0) && (*(long *)(sequenceTupleType + 0x78) != 0)) {
    context_local = *(sysbvm_context_t **)(sequenceTupleType + 0x78);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_context_allocatePointerTuple(context,sequenceTupleType,slotCount_00);
    if (slotCount_00 == 0) {
      *(sysbvm_context_t **)(sequenceTupleType + 0x78) = context_local;
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sequenceTuple_create(sysbvm_context_t *context, sysbvm_tuple_t sequenceTupleType)
{
    if(!sysbvm_tuple_isNonNullPointer(sequenceTupleType)) sysbvm_error_nullArgument();

    sysbvm_sequenceTupleType_t* sequenceTupleTypeObject = (sysbvm_sequenceTupleType_t*)sequenceTupleType;
    size_t slotCount = sysbvm_tuple_size_decode(sequenceTupleTypeObject->super.totalSlotCount);
    if(slotCount == 0 && sequenceTupleTypeObject->super.emptyTrivialSingleton)
        return sequenceTupleTypeObject->super.emptyTrivialSingleton;

    sysbvm_tuple_t result = (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, sequenceTupleType, slotCount);
    if(slotCount == 0)
        sequenceTupleTypeObject->super.emptyTrivialSingleton = result;
    return result;
}